

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void P_FallingDamage(AActor *actor)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int damage;
  DAngle angle;
  double extraout_XMM0_Qa;
  double dVar4;
  FName local_20;
  FSoundID local_1c;
  undefined8 local_18;
  
  uVar2 = (level.flags >> 0xf | dmflags.Value) & 0x18;
  if ((uVar2 != 0) && ((actor->floorsector->Flags & 2) == 0)) {
    angle.Degrees = (actor->Vel).Z;
    dVar4 = ABS(angle.Degrees);
    switch(uVar2) {
    case 8:
      if (dVar4 <= 19.0) {
        return;
      }
      damage = 1000000;
      if (dVar4 < 84.0) {
        angle.Degrees = (angle.Degrees * angle.Degrees * 0.0859375 + -30.0) * 0.5;
        damage = 1;
        if (1 < (int)angle.Degrees) {
          damage = (int)angle.Degrees;
        }
      }
      break;
    case 0x10:
      if (dVar4 <= 23.0) {
        return;
      }
      damage = 1000000;
      if ((dVar4 < 63.0) &&
         (damage = (int)((dVar4 * 0.6956521739130435 * dVar4 * 0.6956521739130435) / 10.0 + -24.0),
         -39.0 < angle.Degrees)) {
        iVar1 = actor->health;
        iVar3 = iVar1 + -1;
        if (iVar1 == 1) {
          iVar3 = damage;
        }
        if (iVar1 < damage) {
          damage = iVar3;
        }
      }
      break;
    case 0x18:
      angle.Degrees = 20.0;
      if (dVar4 <= 20.0) {
        return;
      }
      damage = (int)(dVar4 / 0.3814697265625);
    }
    if (actor->player != (player_t *)0x0) {
      local_1c.ID = S_FindSound("*land");
      S_Sound(actor,0,&local_1c,1.0,1.0);
      P_NoiseAlert(actor,actor,true,0.0);
      angle.Degrees = extraout_XMM0_Qa;
      if ((damage == 1000000) && (damage = 999, (actor->player->cheats & 0x8000002U) == 0)) {
        damage = 1000000;
      }
    }
    local_20.Index = 0xbd;
    local_18 = 0;
    P_DamageMobj(actor,(AActor *)0x0,(AActor *)0x0,damage,&local_20,0,angle);
  }
  return;
}

Assistant:

void P_FallingDamage (AActor *actor)
{
	int damagestyle;
	int damage;
	double vel;

	damagestyle = ((level.flags >> 15) | (dmflags)) &
		(DF_FORCE_FALLINGZD | DF_FORCE_FALLINGHX);

	if (damagestyle == 0)
		return;
		
	if (actor->floorsector->Flags & SECF_NOFALLINGDAMAGE)
		return;

	vel = fabs(actor->Vel.Z);

	// Since Hexen falling damage is stronger than ZDoom's, it takes
	// precedence. ZDoom falling damage may not be as strong, but it
	// gets felt sooner.

	switch (damagestyle)
	{
	case DF_FORCE_FALLINGHX:		// Hexen falling damage
		if (vel <= 23)
		{ // Not fast enough to hurt
			return;
		}
		if (vel >= 63)
		{ // automatic death
			damage = 1000000;
		}
		else
		{
			vel *= (16. / 23);
			damage = int((vel * vel) / 10 - 24);
			if (actor->Vel.Z > -39 && damage > actor->health
				&& actor->health != 1)
			{ // No-death threshold
				damage = actor->health-1;
			}
		}
		break;
	
	case DF_FORCE_FALLINGZD:		// ZDoom falling damage
		if (vel <= 19)
		{ // Not fast enough to hurt
			return;
		}
		if (vel >= 84)
		{ // automatic death
			damage = 1000000;
		}
		else
		{
			damage = int((vel*vel*(11 / 128.) - 30) / 2);
			if (damage < 1)
			{
				damage = 1;
			}
		}
		break;

	case DF_FORCE_FALLINGST:		// Strife falling damage
		if (vel <= 20)
		{ // Not fast enough to hurt
			return;
		}
		// The minimum amount of damage you take from falling in Strife
		// is 52. Ouch!
		damage = int(vel / (25000./65536.));
		break;

	default:
		return;
	}

	if (actor->player)
	{
		S_Sound (actor, CHAN_AUTO, "*land", 1, ATTN_NORM);
		P_NoiseAlert (actor, actor, true);
		if (damage == 1000000 && (actor->player->cheats & (CF_GODMODE | CF_BUDDHA)))
		{
			damage = 999;
		}
	}
	P_DamageMobj (actor, NULL, NULL, damage, NAME_Falling);
}